

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void __thiscall icu_63::UVector::removeAllElements(UVector *this)

{
  int32_t i;
  long lVar1;
  
  if (this->deleter != (UObjectDeleter *)0x0) {
    for (lVar1 = 0; lVar1 < this->count; lVar1 = lVar1 + 1) {
      if (this->elements[lVar1].pointer != (void *)0x0) {
        (*this->deleter)(this->elements[lVar1].pointer);
      }
    }
  }
  this->count = 0;
  return;
}

Assistant:

void UVector::removeAllElements(void) {
    if (deleter != 0) {
        for (int32_t i=0; i<count; ++i) {
            if (elements[i].pointer != 0) {
                (*deleter)(elements[i].pointer);
            }
        }
    }
    count = 0;
}